

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

sz_event sznet::net::sockets::sz_create_eventfd(void)

{
  LogStream *this;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  int local_c;
  int evtfd;
  
  local_c = eventfd(0,0x80800);
  if (local_c < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_ff0,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x1f7,false);
    this = Logger::stream(&local_fe0);
    LogStream::operator<<(this,"Failed in eventfd");
    Logger::~Logger(&local_fe0);
    abort();
  }
  return local_c;
}

Assistant:

sz_event sz_create_eventfd()
{
	int evtfd = ::eventfd(0, EFD_NONBLOCK | EFD_CLOEXEC);
	if (evtfd < 0)
	{
		LOG_SYSERR << "Failed in eventfd";
		abort();
	}

	return evtfd;
}